

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

QString * __thiscall QComboBox::currentText(QComboBox *this)

{
  long lVar1;
  QComboBoxPrivate *pQVar2;
  ulong uVar3;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QComboBoxPrivate *d;
  QModelIndex *this_00;
  QModelIndex *index;
  QPersistentModelIndex in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  index = in_RDI;
  pQVar2 = d_func((QComboBox *)0x5369b7);
  if (pQVar2->lineEdit == (QLineEdit *)0x0) {
    uVar3 = QPersistentModelIndex::isValid();
    if ((uVar3 & 1) == 0) {
      QString::QString((QString *)0x536a3a);
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QPersistentModelIndex *)&stack0xffffffffffffffe0);
      QComboBoxPrivate::itemText((QComboBoxPrivate *)in_stack_ffffffffffffffe0.d,index);
    }
  }
  else {
    QLineEdit::text((QLineEdit *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QComboBox::currentText() const
{
    Q_D(const QComboBox);
    if (d->lineEdit)
        return d->lineEdit->text();
    if (d->currentIndex.isValid())
        return d->itemText(d->currentIndex);
    return {};
}